

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRobustnessTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::egl::anon_unknown_1::ContextResetCase::iterate(ContextResetCase *this)

{
  EGLContext local_1aa0;
  undefined1 local_1a98 [8];
  RenderingContext context;
  EGLint attribList [9];
  undefined1 local_1a38 [8];
  Functions gl;
  ContextResetCase *this_local;
  
  gl.waitSync = (glWaitSyncFunc)this;
  glw::Functions::Functions((Functions *)local_1a38);
  context.m_context._0_4_ = 0x3098;
  context.m_context._4_4_ = 3;
  RobustnessTestCase::Params::getRobustAccessType(&(this->super_RobustnessTestCase).m_params);
  RobustnessTestCase::checkRequiredEGLExtensions
            (&this->super_RobustnessTestCase,(EGLint *)&context.m_context);
  local_1aa0 = (EGLContext)0x0;
  RenderingContext::RenderingContext
            ((RenderingContext *)local_1a98,
             (this->super_RobustnessTestCase).super_TestCase.m_eglTestCtx,
             (EGLint *)&context.m_context,&(this->super_RobustnessTestCase).m_eglConfig,
             &(this->super_RobustnessTestCase).m_eglDisplay,&local_1aa0);
  RenderingContext::makeCurrent
            ((RenderingContext *)local_1a98,&(this->super_RobustnessTestCase).m_eglSurface);
  RenderingContext::initGLFunctions((RenderingContext *)local_1a98,(Functions *)local_1a38);
  checkRequiredGLRobustnessExtension((EGLint *)&context.m_context,(Functions *)local_1a38);
  execute(this,(Functions *)local_1a38);
  RenderingContext::~RenderingContext((RenderingContext *)local_1a98);
  return STOP;
}

Assistant:

TestCase::IterateResult ContextResetCase::iterate (void)
{
	glw::Functions	gl;

	const EGLint attribList[] =
	{
		EGL_CONTEXT_CLIENT_VERSION, 3,
		EGL_CONTEXT_MINOR_VERSION_KHR, 1,
		EGL_CONTEXT_OPENGL_ROBUST_ACCESS_EXT, (m_params.getRobustAccessType() == ROBUSTACCESS_TRUE) ? EGL_TRUE : EGL_FALSE,
		EGL_CONTEXT_OPENGL_RESET_NOTIFICATION_STRATEGY_EXT, EGL_LOSE_CONTEXT_ON_RESET,
		EGL_NONE
	};

	checkRequiredEGLExtensions(attribList);

	RenderingContext context(m_eglTestCtx, attribList, m_eglConfig, m_eglDisplay, EGL_NO_CONTEXT);
	context.makeCurrent(m_eglSurface);

	context.initGLFunctions(&gl);
	checkRequiredGLRobustnessExtension(attribList, gl);

	execute(gl);

	return STOP;
}